

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_asformat.cpp
# Opt level: O3

UnicodeString * __thiscall
icu_63::number::impl::LocalizedNumberFormatterAsFormat::format
          (LocalizedNumberFormatterAsFormat *this,Formattable *obj,UnicodeString *appendTo,
          FieldPositionIterator *posIter,UErrorCode *status)

{
  DecimalQuantity *this_00;
  FieldPositionIteratorHandler fpih;
  UFormattedNumberData data;
  UnicodeString UStack_1c8;
  UFormattedNumberData local_188;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    this_00 = &local_188.quantity;
    local_188.fMagic = 0x46444e00;
    DecimalQuantity::DecimalQuantity(this_00);
    NumberStringBuilder::NumberStringBuilder(&local_188.string);
    Formattable::populateDecimalQuantity(obj,this_00,status);
    if ((*status < U_ILLEGAL_ARGUMENT_ERROR) &&
       (LocalizedNumberFormatter::formatImpl(&this->fFormatter,&local_188,status),
       *status < U_ILLEGAL_ARGUMENT_ERROR)) {
      NumberStringBuilder::toTempUnicodeString(&UStack_1c8,&local_188.string);
      if (-1 < UStack_1c8.fUnion.fStackFields.fLengthAndFlags) {
        UStack_1c8.fUnion.fFields.fLength = (int)UStack_1c8.fUnion.fStackFields.fLengthAndFlags >> 5
        ;
      }
      UnicodeString::doAppend(appendTo,&UStack_1c8,0,UStack_1c8.fUnion.fFields.fLength);
      UnicodeString::~UnicodeString(&UStack_1c8);
      if (posIter != (FieldPositionIterator *)0x0) {
        FieldPositionIteratorHandler::FieldPositionIteratorHandler
                  ((FieldPositionIteratorHandler *)&UStack_1c8,posIter,status);
        NumberStringBuilder::getAllFieldPositions
                  (&local_188.string,(FieldPositionIteratorHandler *)&UStack_1c8,status);
        FieldPositionIteratorHandler::~FieldPositionIteratorHandler
                  ((FieldPositionIteratorHandler *)&UStack_1c8);
      }
    }
    NumberStringBuilder::~NumberStringBuilder(&local_188.string);
    DecimalQuantity::~DecimalQuantity(this_00);
  }
  return appendTo;
}

Assistant:

UnicodeString& LocalizedNumberFormatterAsFormat::format(const Formattable& obj, UnicodeString& appendTo,
                                                        FieldPositionIterator* posIter,
                                                        UErrorCode& status) const {
    if (U_FAILURE(status)) { return appendTo; }
    UFormattedNumberData data;
    obj.populateDecimalQuantity(data.quantity, status);
    if (U_FAILURE(status)) {
        return appendTo;
    }
    fFormatter.formatImpl(&data, status);
    if (U_FAILURE(status)) {
        return appendTo;
    }
    appendTo.append(data.string.toTempUnicodeString());
    if (posIter != nullptr) {
        FieldPositionIteratorHandler fpih(posIter, status);
        data.string.getAllFieldPositions(fpih, status);
    }
    return appendTo;
}